

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_1::WatWriter::WriteNextChar(WatWriter *this)

{
  undefined1 *src;
  Stream *this_00;
  ulong size;
  undefined1 local_1a;
  undefined1 local_19;
  
  if (this->next_char_ - Newline < 2) {
    local_19 = 10;
    Stream::WriteData(this->stream_,&local_19,1,(char *)0x0,No);
    for (size = (ulong)this->indent_; 0x8d < size; size = size - 0x8e) {
      Stream::WriteData(this->stream_,(anonymous_namespace)::WatWriter::WriteIndent()::s_indent,0x8e
                        ,(char *)0x0,No);
    }
    if (size == 0) goto LAB_0017cdb9;
    this_00 = this->stream_;
    src = (anonymous_namespace)::WatWriter::WriteIndent()::s_indent;
  }
  else {
    if (this->next_char_ != Space) goto LAB_0017cdb9;
    this_00 = this->stream_;
    src = &local_1a;
    local_1a = 0x20;
    size = 1;
  }
  Stream::WriteData(this_00,src,size,(char *)0x0,No);
LAB_0017cdb9:
  this->next_char_ = None;
  return;
}

Assistant:

void WatWriter::WriteNextChar() {
  switch (next_char_) {
    case NextChar::Space:
      stream_->WriteChar(' ');
      break;
    case NextChar::Newline:
    case NextChar::ForceNewline:
      stream_->WriteChar('\n');
      WriteIndent();
      break;
    case NextChar::None:
      break;
  }
  next_char_ = NextChar::None;
}